

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::VRegistry::setFromArgs(VRegistry *this,CommandLineArgs *commandLineArgs)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RDI;
  VRegistry *unaff_retaddr;
  char *in_stack_00000058;
  CommandLineArgs *in_stack_00000060;
  char *in_stack_00000068;
  CommandLineArgs *in_stack_00000070;
  char *in_stack_00000228;
  VRegistry *in_stack_00000230;
  VerboseLevel level;
  
  level = (VerboseLevel)((ulong)in_RDI >> 0x30);
  bVar1 = utils::CommandLineArgs::hasParam(in_stack_00000070,in_stack_00000068);
  if ((((bVar1) ||
       (bVar1 = utils::CommandLineArgs::hasParam(in_stack_00000070,in_stack_00000068), bVar1)) ||
      (bVar1 = utils::CommandLineArgs::hasParam(in_stack_00000070,in_stack_00000068), bVar1)) ||
     (bVar1 = utils::CommandLineArgs::hasParam(in_stack_00000070,in_stack_00000068), bVar1)) {
    setLevel(unaff_retaddr,level);
  }
  else {
    bVar1 = utils::CommandLineArgs::hasParamWithValue(in_stack_00000060,in_stack_00000058);
    if (bVar1) {
      pcVar2 = utils::CommandLineArgs::getParamValue(in_stack_00000060,in_stack_00000058);
      atoi(pcVar2);
      setLevel(unaff_retaddr,level);
    }
    else {
      bVar1 = utils::CommandLineArgs::hasParamWithValue(in_stack_00000060,in_stack_00000058);
      if (bVar1) {
        pcVar2 = utils::CommandLineArgs::getParamValue(in_stack_00000060,in_stack_00000058);
        atoi(pcVar2);
        setLevel(unaff_retaddr,level);
      }
      else {
        bVar1 = utils::CommandLineArgs::hasParamWithValue(in_stack_00000060,in_stack_00000058);
        if ((bVar1) && (bVar1 = vModulesEnabled((VRegistry *)0x230a72), bVar1)) {
          utils::CommandLineArgs::getParamValue(in_stack_00000060,in_stack_00000058);
          setModules(in_stack_00000230,in_stack_00000228);
        }
        else {
          bVar1 = utils::CommandLineArgs::hasParamWithValue(in_stack_00000060,in_stack_00000058);
          if ((bVar1) && (bVar1 = vModulesEnabled((VRegistry *)0x230ab7), bVar1)) {
            utils::CommandLineArgs::getParamValue(in_stack_00000060,in_stack_00000058);
            setModules(in_stack_00000230,in_stack_00000228);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void VRegistry::setFromArgs(const base::utils::CommandLineArgs* commandLineArgs) {
  if (commandLineArgs->hasParam("-v") || commandLineArgs->hasParam("--verbose") ||
      commandLineArgs->hasParam("-V") || commandLineArgs->hasParam("--VERBOSE")) {
    setLevel(base::consts::kMaxVerboseLevel);
  } else if (commandLineArgs->hasParamWithValue("--v")) {
    setLevel(static_cast<base::type::VerboseLevel>(atoi(commandLineArgs->getParamValue("--v"))));
  } else if (commandLineArgs->hasParamWithValue("--V")) {
    setLevel(static_cast<base::type::VerboseLevel>(atoi(commandLineArgs->getParamValue("--V"))));
  } else if ((commandLineArgs->hasParamWithValue("-vmodule")) && vModulesEnabled()) {
    setModules(commandLineArgs->getParamValue("-vmodule"));
  } else if (commandLineArgs->hasParamWithValue("-VMODULE") && vModulesEnabled()) {
    setModules(commandLineArgs->getParamValue("-VMODULE"));
  }
}